

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

VarPackedStruct * __thiscall
kratos::Generator::var_packed
          (Generator *this,string *var_name,shared_ptr<kratos::PackedStruct> *packed_struct_,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *this_00;
  iterator iVar1;
  VarException *this_01;
  mapped_type *pmVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  element_type *local_60;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::VarPackedStruct> v;
  allocator_type local_31;
  
  this_00 = &this->vars_;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&this_00->_M_t,var_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    local_80._M_dataplus._M_p = (pointer)this;
    std::
    make_shared<kratos::VarPackedStruct,kratos::Generator*,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
              ((Generator **)auStack_58,&local_80,(shared_ptr<kratos::PackedStruct> *)var_name,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)packed_struct_);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::VarPackedStruct>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)this_00,var_name,(shared_ptr<kratos::VarPackedStruct> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
    return (VarPackedStruct *)auStack_58;
  }
  this_01 = (VarException *)__cxa_allocate_exception(0x10);
  auStack_58 = (undefined1  [8])(var_name->_M_dataplus)._M_p;
  v.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)var_name->_M_string_length;
  v.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->name)._M_dataplus._M_p;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_80,(detail *)bVar3.data_,format_str,args);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
           ::at(this_00,var_name);
  local_60 = (pmVar2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_58,
             __l,&local_31);
  VarException::VarException
            (this_01,&local_80,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_58);
  __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VarPackedStruct &Generator::var_packed(const std::string &var_name,
                                       const std::shared_ptr<PackedStruct> &packed_struct_,
                                       const std::vector<uint32_t> &size) {
    if (vars_.find(var_name) != vars_.end())
        throw VarException(::format("{0} already exists in {1}", var_name, name),
                           {vars_.at(var_name).get()});
    auto v = std::make_shared<VarPackedStruct>(this, var_name, packed_struct_, size);
    vars_.emplace(var_name, v);
    return *v;
}